

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::TaskStmtBlock::~TaskStmtBlock(TaskStmtBlock *this)

{
  FunctionStmtBlock::~FunctionStmtBlock(&this->super_FunctionStmtBlock);
  operator_delete(this,0x180);
  return;
}

Assistant:

TaskStmtBlock(Generator *parent, std::string function_name)
        : FunctionStmtBlock(parent, std::move(function_name)) {}